

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

uint32_t __thiscall Catch::TestCaseInfoHasher::operator()(TestCaseInfoHasher *this,TestCaseInfo *t)

{
  size_type sVar1;
  size_type sVar2;
  Tag *tag;
  pointer pTVar3;
  long lVar4;
  ulong uVar5;
  size_type sVar6;
  size_type sVar7;
  
  uVar5 = 0xcbf29ce484222325;
  sVar1 = (t->name)._M_string_length;
  if (sVar1 == 0) {
    uVar5 = 0xcbf29ce484222325;
  }
  else {
    sVar6 = 0;
    do {
      uVar5 = ((long)(t->name)._M_dataplus._M_p[sVar6] ^ uVar5) * 0x100000001b3;
      sVar6 = sVar6 + 1;
    } while (sVar1 != sVar6);
  }
  sVar2 = (t->className).m_size;
  if (sVar2 != 0) {
    sVar7 = 0;
    do {
      uVar5 = ((long)(t->className).m_start[sVar7] ^ uVar5) * 0x100000001b3;
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
  }
  for (pTVar3 = (t->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                super__Vector_impl_data._M_start;
      pTVar3 != (t->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                super__Vector_impl_data._M_finish; pTVar3 = pTVar3 + 1) {
    sVar2 = (pTVar3->original).m_size;
    if (sVar2 != 0) {
      sVar7 = 0;
      do {
        uVar5 = ((long)(pTVar3->original).m_start[sVar7] ^ uVar5) * 0x100000001b3;
        sVar7 = sVar7 + 1;
      } while (sVar2 != sVar7);
    }
  }
  lVar4 = (uVar5 ^ this->m_seed) * 0x100000001b3;
  return (int)((ulong)lVar4 >> 0x20) * (int)lVar4;
}

Assistant:

uint32_t TestCaseInfoHasher::operator()( TestCaseInfo const& t ) const {
        // FNV-1a hash algorithm that is designed for uniqueness:
        const hash_t prime = 1099511628211u;
        hash_t hash = 14695981039346656037u;
        for ( const char c : t.name ) {
            hash ^= c;
            hash *= prime;
        }
        for ( const char c : t.className ) {
            hash ^= c;
            hash *= prime;
        }
        for ( const Tag& tag : t.tags ) {
            for ( const char c : tag.original ) {
                hash ^= c;
                hash *= prime;
            }
        }
        hash ^= m_seed;
        hash *= prime;
        const uint32_t low{ static_cast<uint32_t>( hash ) };
        const uint32_t high{ static_cast<uint32_t>( hash >> 32 ) };
        return low * high;
    }